

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O2

void PPrintTag(TidyDocImpl *doc,uint mode,uint indent,Node *node)

{
  TidyPrintImpl *pprint_00;
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  Bool BVar5;
  int iVar6;
  AttVal *pAVar7;
  char *node_00;
  uint indent_00;
  TidyPrintImpl *pprint;
  byte *str;
  Node *attr;
  tchar c;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  pprint_00 = &doc->pprint;
  iVar6 = *(int *)((doc->config).value + 0x55);
  local_38 = (ulong)*(uint *)((doc->config).value + 0x62);
  local_40 = (ulong)*(uint *)((doc->config).value + 100);
  str = (byte *)node->element;
  node_00 = (char *)node;
  local_44 = mode;
  AddChar(pprint_00,0x3c);
  if (node->type == EndTag) {
    AddChar(pprint_00,0x2f);
  }
  if (str != (byte *)0x0) {
    for (; bVar1 = *str, bVar1 != 0; str = str + 1) {
      c = (tchar)bVar1;
      if ((char)bVar1 < '\0') {
        uVar4 = prvTidyGetUTF8((ctmbstr)str,&c);
        str = str + uVar4;
      }
      else if (iVar6 != 0) {
        c = prvTidyToUpper(c);
      }
      AddChar(pprint_00,c);
    }
  }
  if ((((*(int *)((doc->config).value + 100) != 0) && (*(int *)((doc->config).value + 0x66) != 0))
      && (pAVar7 = prvTidyGetAttrByName(node,"xml:space"), pAVar7 == (AttVal *)0x0)) &&
     (BVar5 = prvTidyXMLPreserveWhiteSpace(doc,node), BVar5 != no)) {
    node_00 = "preserve";
    prvTidyAddAttribute(doc,node,"xml:space","preserve");
  }
  attr = (Node *)&node->attributes;
  while (uVar3 = local_38, attr = attr->parent, attr != (Node *)0x0) {
    if (attr->attributes == (AttVal *)0x0) {
      if (attr->next == (Node *)0x0) {
        if (attr->content != (Node *)0x0) {
          AddChar(pprint_00,0x20);
          PPrintPhp(doc,indent,attr->content);
        }
      }
      else {
        AddChar(pprint_00,0x20);
        PPrintAsp(doc,indent,attr->next);
      }
    }
    else {
      node_00 = (char *)attr;
      PPrintAttribute(doc,indent,node,(AttVal *)attr);
    }
  }
  local_40 = local_40 | local_38;
  if ((local_40 != 0) &&
     ((node->type == StartEndTag || (BVar5 = prvTidynodeCMIsEmpty(node), BVar5 != no)))) {
    AddChar(pprint_00,0x20);
    AddChar(pprint_00,0x2f);
  }
  AddChar(pprint_00,0x3e);
  if (((node->type == StartEndTag) && (iVar6 = prvTidyHTMLVersion(doc), iVar6 == 0x20000)) &&
     (BVar5 = prvTidynodeHasCM(node,0x400000), BVar5 == no)) {
    PPrintEndTag(doc,(uint)node,indent_00,(Node *)node_00);
  }
  uVar4 = local_44;
  if (node->type == StartEndTag && uVar3 == 0) {
    iVar6 = prvTidyHTMLVersion(doc);
    if ((uVar4 & 1) != 0 || iVar6 != 0x20000) {
      return;
    }
  }
  else if ((local_44 & 1) != 0) {
    return;
  }
  uVar2 = *(uint *)((doc->config).value + 0x5d);
  CheckWrapIndent(doc,indent);
  if ((doc->pprint).linelen + indent < uVar2) {
    if (((uVar4 & 8) == 0) &&
       (((BVar5 = prvTidynodeCMIsInline(node), BVar5 == no ||
         ((node->tag != (Dict *)0x0 && (node->tag->id == TidyTag_BR)))) &&
        (BVar5 = AfterSpace(doc->lexer,node), BVar5 != no)))) {
      (doc->pprint).wraphere = (doc->pprint).linelen;
    }
  }
  else if (((uVar4 & 8) != 0) ||
          (((node->tag != (Dict *)0x0 && (node->tag->id == TidyTag_BR)) ||
           (BVar5 = AfterSpace(doc->lexer,node), BVar5 != no)))) {
    PCondFlushLineSmart(doc,indent);
  }
  return;
}

Assistant:

static void PPrintTag( TidyDocImpl* doc,
                       uint mode, uint indent, Node *node )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool uc = cfgBool( doc, TidyUpperCaseTags );
    Bool xhtmlOut = cfgBool( doc, TidyXhtmlOut );
    Bool xmlOut = cfgBool( doc, TidyXmlOut );
    tchar c;
    tmbstr s = node->element;

    AddChar( pprint, '<' );

    if ( node->type == EndTag )
        AddChar( pprint, '/' );

    if (s)
    {
        while (*s)
        {
            c = (unsigned char)*s;

            if (c > 0x7F)
                s += TY_(GetUTF8)(s, &c);
            else if (uc)
                c = TY_(ToUpper)(c);

            AddChar(pprint, c);
            ++s;
        }
    }

    PPrintAttrs( doc, indent, node );

    if ( (xmlOut || xhtmlOut) &&
         (node->type == StartEndTag || TY_(nodeCMIsEmpty)(node)) )
    {
        AddChar( pprint, ' ' );   /* Space is NS compatibility hack <br /> */
        AddChar( pprint, '/' );   /* Required end tag marker */
    }

    AddChar( pprint, '>' );

    /*\
     *  Appears this was added for Issue #111, #112, #113, but will now add an end tag
     *  for elements like <img ...> which do NOT have an EndTag, even in html5
     *  See Issue #162 - void elements also get a closing tag, like img, br, ...
     *  A complete list of the void elements in HTML.
     *  area, base, br, col, command, embed, hr, img, input, keygen, link, meta, param, source, track, wbr
     *  A new CM_VOID was added to tag_defs[] to account for these.
    \*/
    if ((node->type == StartEndTag && TY_(HTMLVersion)(doc) == HT50) && !TY_(nodeHasCM)(node, CM_VOID ) )
    {
        PPrintEndTag( doc, mode, indent, node );
    }

    if ( (node->type != StartEndTag || xhtmlOut || (node->type == StartEndTag && TY_(HTMLVersion)(doc) == HT50)) && !(mode & PREFORMATTED) )
    {
        uint wraplen = cfg( doc, TidyWrapLen );
        CheckWrapIndent( doc, indent );

        if ( indent + pprint->linelen < wraplen )
        {
            /* wrap after start tag if is <br/> or if it's not inline.
               Technically, it would be safe to call only AfterSpace.
               However, it would disrupt the existing algorithm. So let's
               leave as is. Note that AfterSpace returns true for non inline
               elements but can still be false for some <br>. So it has to
               stay as well. */
            if (!(mode & NOWRAP)
                && (!TY_(nodeCMIsInline)(node) || nodeIsBR(node))
                && AfterSpace(doc->lexer, node))
            {
                pprint->wraphere = pprint->linelen;
            }
        }
        /* flush the current buffer only if it is known to be safe,
           i.e. it will not introduce some spurious white spaces.
           See bug #996484 */
        else if ( mode & NOWRAP ||
                  nodeIsBR(node) || AfterSpace(doc->lexer, node))
            PCondFlushLineSmart( doc, indent );
    }
}